

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::MultiThreadedObjectTest::destroyObjects(MultiThreadedObjectTest *this,TestThread *thread)

{
  EGLDisplay pvVar1;
  vector<void_*,_std::allocator<void_*>_> *pvVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  size_type sVar6;
  reference ppvVar7;
  ThreadLog *pTVar8;
  reference pvVar9;
  reference pvVar10;
  vector<void_*,_std::allocator<void_*>_> *local_80;
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  *local_78;
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  *local_70;
  vector<void_*,_std::allocator<void_*>_> *local_68;
  int local_54;
  int local_50;
  int contextNdx;
  int pixmapNdx;
  int windowNdx;
  EGLBoolean result;
  int pbufferNdx;
  vector<void_*,_std::allocator<void_*>_> *contexts;
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  *pixmaps;
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  *windows;
  vector<void_*,_std::allocator<void_*>_> *pbuffers;
  Library *egl;
  TestThread *thread_local;
  MultiThreadedObjectTest *this_local;
  
  egl = (Library *)thread;
  thread_local = (TestThread *)this;
  pbuffers = (vector<void_*,_std::allocator<void_*>_> *)
             MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  iVar3 = TestThread::getId((TestThread *)egl);
  if (iVar3 == 0) {
    local_68 = &this->m_pbuffers0;
  }
  else {
    local_68 = &this->m_pbuffers1;
  }
  windows = (vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             *)local_68;
  iVar3 = TestThread::getId((TestThread *)egl);
  if (iVar3 == 0) {
    local_70 = &this->m_nativeWindows0;
  }
  else {
    local_70 = &this->m_nativeWindows1;
  }
  pixmaps = (vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
             *)local_70;
  iVar3 = TestThread::getId((TestThread *)egl);
  if (iVar3 == 0) {
    local_78 = &this->m_nativePixmaps0;
  }
  else {
    local_78 = &this->m_nativePixmaps1;
  }
  contexts = (vector<void_*,_std::allocator<void_*>_> *)local_78;
  iVar3 = TestThread::getId((TestThread *)egl);
  if (iVar3 == 0) {
    local_80 = &this->m_contexts0;
  }
  else {
    local_80 = &this->m_contexts1;
  }
  _result = local_80;
  for (windowNdx = 0; iVar3 = windowNdx,
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)windows), iVar3 < (int)sVar6;
      windowNdx = windowNdx + 1) {
    ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)windows,(long)windowNdx);
    pvVar2 = pbuffers;
    if (*ppvVar7 != (value_type)0x0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)windows,(long)windowNdx);
      pixmapNdx = (*(code *)(pvVar2->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                            super__Vector_impl_data._M_start[0x16])(pvVar2,pvVar1,*ppvVar7);
      pTVar8 = TestThread::getLog((TestThread *)egl);
      pTVar8 = ThreadLog::operator<<(pTVar8,(BeginMessageToken *)&ThreadLog::BeginMessage);
      pTVar8 = ThreadLog::operator<<(pTVar8,(uint *)&pixmapNdx);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [22])" = eglDestroySurface(");
      pTVar8 = ThreadLog::operator<<(pTVar8,&(this->super_MultiThreadedTest).m_display);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [3])0x2a3caab);
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)windows,(long)windowNdx);
      pTVar8 = ThreadLog::operator<<(pTVar8,ppvVar7);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [2])0x2a85ff4);
      ThreadLog::operator<<(pTVar8,(EndMessageToken *)&ThreadLog::EndMessage);
      dVar4 = (*(code *)(pbuffers->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[0x1f])();
      eglu::checkError(dVar4,"eglDestroySurface()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x5aa);
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)windows,(long)windowNdx);
      *ppvVar7 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear
            ((vector<void_*,_std::allocator<void_*>_> *)windows);
  for (contextNdx = 0;
      sVar6 = std::
              vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
              ::size((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                      *)pixmaps), contextNdx < (int)sVar6; contextNdx = contextNdx + 1) {
    pvVar9 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[]((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                           *)pixmaps,(long)contextNdx);
    if (pvVar9->second != (void *)0x0) {
      pTVar8 = TestThread::getLog((TestThread *)egl);
      pTVar8 = ThreadLog::operator<<(pTVar8,(BeginMessageToken *)&ThreadLog::BeginMessage);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [19])0x2b3ce74);
      pTVar8 = ThreadLog::operator<<(pTVar8,&(this->super_MultiThreadedTest).m_display);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [3])0x2a3caab);
      pvVar9 = std::
               vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ::operator[]((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                             *)pixmaps,(long)contextNdx);
      pTVar8 = ThreadLog::operator<<(pTVar8,&pvVar9->second);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [2])0x2a85ff4);
      ThreadLog::operator<<(pTVar8,(EndMessageToken *)&ThreadLog::EndMessage);
      do {
        pvVar2 = pbuffers;
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar9 = std::
                 vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ::operator[]((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                               *)pixmaps,(long)contextNdx);
        (*(code *)(pvVar2->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[0x16])(pvVar2,pvVar1,pvVar9->second);
        dVar4 = (*(code *)(pbuffers->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                          super__Vector_impl_data._M_start[0x1f])();
        eglu::checkError(dVar4,"destroySurface(m_display, windows[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5b5);
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      pvVar9 = std::
               vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ::operator[]((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                             *)pixmaps,(long)contextNdx);
      pvVar9->second = (void *)0x0;
    }
    pvVar9 = std::
             vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
             ::operator[]((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                           *)pixmaps,(long)contextNdx);
    if (pvVar9->first != (NativeWindow *)0x0) {
      pvVar9 = std::
               vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ::operator[]((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                             *)pixmaps,(long)contextNdx);
      if (pvVar9->first != (NativeWindow *)0x0) {
        (*pvVar9->first->_vptr_NativeWindow[1])();
      }
      pvVar9 = std::
               vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ::operator[]((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                             *)pixmaps,(long)contextNdx);
      pvVar9->first = (NativeWindow *)0x0;
    }
  }
  std::
  vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
  ::clear((vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           *)pixmaps);
  for (local_50 = 0;
      sVar6 = std::
              vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ::size((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                      *)contexts), local_50 < (int)sVar6; local_50 = local_50 + 1) {
    pvVar10 = std::
              vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ::operator[]((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                            *)contexts,(long)local_50);
    if (pvVar10->first != (NativePixmap *)0x0) {
      pTVar8 = TestThread::getLog((TestThread *)egl);
      pTVar8 = ThreadLog::operator<<(pTVar8,(BeginMessageToken *)&ThreadLog::BeginMessage);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [19])0x2b3ce74);
      pTVar8 = ThreadLog::operator<<(pTVar8,&(this->super_MultiThreadedTest).m_display);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [3])0x2a3caab);
      pvVar10 = std::
                vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                ::operator[]((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                              *)contexts,(long)local_50);
      pTVar8 = ThreadLog::operator<<(pTVar8,&pvVar10->second);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [2])0x2a85ff4);
      ThreadLog::operator<<(pTVar8,(EndMessageToken *)&ThreadLog::EndMessage);
      do {
        pvVar2 = pbuffers;
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        pvVar10 = std::
                  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                  ::operator[]((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                *)contexts,(long)local_50);
        (*(code *)(pvVar2->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[0x16])(pvVar2,pvVar1,pvVar10->second);
        dVar4 = (*(code *)(pbuffers->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                          super__Vector_impl_data._M_start[0x1f])();
        eglu::checkError(dVar4,"destroySurface(m_display, pixmaps[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5c6);
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      pvVar10 = std::
                vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                ::operator[]((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                              *)contexts,(long)local_50);
      pvVar10->second = (void *)0x0;
    }
    pvVar10 = std::
              vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
              ::operator[]((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                            *)contexts,(long)local_50);
    if (pvVar10->first != (NativePixmap *)0x0) {
      pvVar10 = std::
                vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                ::operator[]((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                              *)contexts,(long)local_50);
      if (pvVar10->first != (NativePixmap *)0x0) {
        (**(code **)(*(long *)pvVar10->first + 8))();
      }
      pvVar10 = std::
                vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                ::operator[]((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                              *)contexts,(long)local_50);
      pvVar10->first = (NativePixmap *)0x0;
    }
  }
  std::
  vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
  ::clear((vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           *)contexts);
  for (local_54 = 0; sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size(_result),
      local_54 < (int)sVar6; local_54 = local_54 + 1) {
    ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](_result,(long)local_54);
    if (*ppvVar7 != (value_type)0x0) {
      do {
        pvVar2 = pbuffers;
        pvVar1 = (this->super_MultiThreadedTest).m_display;
        ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](_result,(long)local_54);
        (*(code *)(pvVar2->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[0x13])(pvVar2,pvVar1,*ppvVar7);
        dVar4 = (*(code *)(pbuffers->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                          super__Vector_impl_data._M_start[0x1f])();
        eglu::checkError(dVar4,"destroyContext(m_display, contexts[contextNdx])",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5d6);
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      pTVar8 = TestThread::getLog((TestThread *)egl);
      pTVar8 = ThreadLog::operator<<(pTVar8,(BeginMessageToken *)&ThreadLog::BeginMessage);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [19])0x2b3cbf7);
      pTVar8 = ThreadLog::operator<<(pTVar8,&(this->super_MultiThreadedTest).m_display);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [3])0x2a3caab);
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](_result,(long)local_54);
      pTVar8 = ThreadLog::operator<<(pTVar8,ppvVar7);
      pTVar8 = ThreadLog::operator<<(pTVar8,(char (*) [2])0x2a85ff4);
      ThreadLog::operator<<(pTVar8,(EndMessageToken *)&ThreadLog::EndMessage);
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[](_result,(long)local_54);
      *ppvVar7 = (value_type)0x0;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(_result);
  return;
}

Assistant:

void MultiThreadedObjectTest::destroyObjects (TestThread& thread)
{
	const Library&										egl			= getLibrary();
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < (int)pbuffers.size(); pbufferNdx++)
	{
		if (pbuffers[pbufferNdx] != EGL_NO_SURFACE)
		{
			// Destroy EGLSurface
			EGLBoolean result;

			result = egl.destroySurface(m_display, pbuffers[pbufferNdx]);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglDestroySurface(" << m_display << ", " << pbuffers[pbufferNdx] << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			pbuffers[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	pbuffers.clear();

	for (int windowNdx = 0; windowNdx < (int)windows.size(); windowNdx++)
	{
		if (windows[windowNdx].second != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << windows[windowNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, windows[windowNdx].second));
			windows[windowNdx].second = EGL_NO_SURFACE;
		}

		if (windows[windowNdx].first)
		{
			delete windows[windowNdx].first;
			windows[windowNdx].first = NULL;
		}
	}
	windows.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)pixmaps.size(); pixmapNdx++)
	{
		if (pixmaps[pixmapNdx].first != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << pixmaps[pixmapNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, pixmaps[pixmapNdx].second));
			pixmaps[pixmapNdx].second = EGL_NO_SURFACE;
		}

		if (pixmaps[pixmapNdx].first)
		{
			delete pixmaps[pixmapNdx].first;
			pixmaps[pixmapNdx].first = NULL;
		}
	}
	pixmaps.clear();

	for (int contextNdx = 0; contextNdx < (int)contexts.size(); contextNdx++)
	{
		if (contexts[contextNdx] != EGL_NO_CONTEXT)
		{
			EGLU_CHECK_CALL(egl, destroyContext(m_display, contexts[contextNdx]));
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroyContext(" << m_display << ", " << contexts[contextNdx]  << ")" << ThreadLog::EndMessage;
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}
	}
	contexts.clear();
}